

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_gamma.c
# Opt level: O0

uint32_t FixedPointInterpolation(int v,uint32_t *tab,int tab_pos_shift_right,int tab_value_shift)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  uint32_t result;
  int half;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  uint32_t x;
  uint32_t tab_pos;
  undefined4 local_38;
  
  uVar1 = Shift(in_EDI,-in_EDX);
  bVar4 = (byte)in_EDX;
  iVar2 = Shift(*(int *)(in_RSI + (ulong)uVar1 * 4),in_ECX);
  iVar3 = Shift(*(int *)(in_RSI + (ulong)(uVar1 + 1) * 4),in_ECX);
  if (in_EDX < 1) {
    local_38 = 0;
  }
  else {
    local_38 = 1 << (bVar4 - 1 & 0x1f);
  }
  return iVar2 + ((iVar3 - iVar2) * (in_EDI - (uVar1 << (bVar4 & 0x1f))) + local_38 >>
                 (bVar4 & 0x1f));
}

Assistant:

static WEBP_INLINE uint32_t FixedPointInterpolation(int v, uint32_t* tab,
                                                    int tab_pos_shift_right,
                                                    int tab_value_shift) {
  const uint32_t tab_pos = Shift(v, -tab_pos_shift_right);
  // fractional part, in 'tab_pos_shift' fixed-point precision
  const uint32_t x = v - (tab_pos << tab_pos_shift_right);  // fractional part
  // v0 / v1 are in kGammaToLinearBits fixed-point precision (range [0..1])
  const uint32_t v0 = Shift(tab[tab_pos + 0], tab_value_shift);
  const uint32_t v1 = Shift(tab[tab_pos + 1], tab_value_shift);
  // Final interpolation.
  const uint32_t v2 = (v1 - v0) * x;  // note: v1 >= v0.
  const int half =
      (tab_pos_shift_right > 0) ? 1 << (tab_pos_shift_right - 1) : 0;
  const uint32_t result = v0 + ((v2 + half) >> tab_pos_shift_right);
  return result;
}